

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayFreeArrayBufferHelper.cpp
# Opt level: O3

void __thiscall
Js::DelayedFreeArrayBuffer::CheckAndMarkObject(DelayedFreeArrayBuffer *this,void *candidate)

{
  Type pAVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  Type *ppAVar6;
  Iterator local_40;
  
  local_40.list =
       (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount> *)
       this;
  local_40.current = (NodeBase *)this;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  while( true ) {
    if ((SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount> *)
        this == (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
                 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      this = (DelayedFreeArrayBuffer *)local_40.current;
    }
    local_40.current =
         (((DelayedFreeBufferType *)
          &((SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
             *)this)->super_SListNodeBase<Memory::HeapAllocator>)->
         super_SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
         ).super_SListNodeBase<Memory::HeapAllocator>.next;
    if ((SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount> *)
        local_40.current == local_40.list) break;
    ppAVar6 = SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
              ::Iterator::Data(&local_40);
    pAVar1 = *ppAVar6;
    iVar4 = (*pAVar1->_vptr_ArrayBufferContentForDelayedFreeBase[6])(pAVar1);
    this = (DelayedFreeArrayBuffer *)local_40.current;
    if (((char)iVar4 == '\0') &&
       (iVar4 = (*pAVar1->_vptr_ArrayBufferContentForDelayedFreeBase[3])(pAVar1,candidate),
       this = (DelayedFreeArrayBuffer *)local_40.current, (char)iVar4 != '\0')) {
      (*pAVar1->_vptr_ArrayBufferContentForDelayedFreeBase[5])(pAVar1,1);
      this = (DelayedFreeArrayBuffer *)local_40.current;
    }
  }
  return;
}

Assistant:

void DelayedFreeArrayBuffer::CheckAndMarkObject(void * candidate)
    {
        this->listOfBuffers.Map([&](Js::ArrayBufferContentForDelayedFreeBase* item) {
            if (!item->IsMarked() && item->IsAddressPartOfBuffer(candidate))
            {
                item->SetMarkBit(true);
            }
        });
    }